

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.h
# Opt level: O0

btTransform * __thiscall btSoftBody::Body::xform(Body *this)

{
  int iVar1;
  btTransform *this_00;
  long *in_RDI;
  btTransform *in_stack_ffffffffffffffc8;
  btTransform *local_8;
  
  if (xform()::identity == '\0') {
    iVar1 = __cxa_guard_acquire(&xform()::identity);
    if (iVar1 != 0) {
      this_00 = btTransform::getIdentity();
      btTransform::btTransform(this_00,in_stack_ffffffffffffffc8);
      __cxa_guard_release(&xform()::identity);
    }
  }
  if (in_RDI[2] == 0) {
    if (*in_RDI == 0) {
      local_8 = &xform::identity;
    }
    else {
      local_8 = (btTransform *)(*in_RDI + 0x60);
    }
  }
  else {
    local_8 = btCollisionObject::getWorldTransform((btCollisionObject *)in_RDI[2]);
  }
  return local_8;
}

Assistant:

const btTransform&			xform() const
		{
			static const btTransform	identity=btTransform::getIdentity();		
			if(m_collisionObject) return(m_collisionObject->getWorldTransform());
			if(m_soft)	return(m_soft->m_framexform);
			return(identity);
		}